

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

void * __thiscall mpt::array::set(array *this,size_t len,void *base)

{
  content *pcVar1;
  uint uVar2;
  void *pvVar3;
  buffer *this_00;
  size_t len_00;
  
  this_00 = (buffer *)(this->_buf)._ref;
  if ((this_00 != (buffer *)0x0) && (this_00->_content_traits == (type_traits *)0x0)) {
    uVar2 = (**this_00->_vptr_buffer)(this_00);
    if ((uVar2 >> 8 & 1) == 0) {
      len_00 = len - this_00->_used;
      if (len < this_00->_used || len_00 == 0) {
        if ((this_00->_content_traits == (type_traits *)0x0) && (len <= this_00->_size)) {
          this_00->_used = len;
        }
        goto LAB_00128dbb;
      }
      pvVar3 = buffer::append(this_00,len_00);
      if (pvVar3 != (void *)0x0) goto LAB_00128dbb;
    }
  }
  this_00 = (buffer *)_mpt_buffer_alloc(len,0);
  if (this_00 != (buffer *)0x0) {
    this_00->_content_traits = (type_traits *)0x0;
    pvVar3 = buffer::append(this_00,len);
    if (pvVar3 != (void *)0x0) {
      pcVar1 = (this->_buf)._ref;
      if (pcVar1 != (content *)0x0) {
        (**(code **)(*(long *)pcVar1 + 8))();
      }
      (this->_buf)._ref = (content *)this_00;
LAB_00128dbb:
      if (base != (void *)0x0) {
        pvVar3 = memcpy(this_00 + 1,base,len);
        return pvVar3;
      }
      pvVar3 = memset(this_00 + 1,0,len);
      return pvVar3;
    }
    (*this_00->_vptr_buffer[1])(this_00);
  }
  return (void *)0x0;
}

Assistant:

void *array::set(size_t len, const void *base)
{
	content *d;
	
	if ((d = _buf.instance())) {
		size_t used;
		/* incompatible target buffer */
		if (d->content_traits() || d->shared()) {
			d = 0;
		}
		else if (len <= (used = d->length())) {
			d->set_length(len);
		}
		/* reserve uninitialized data */
		else if (!d->append(len - used)) {
			d = 0;
		}
	}
	if (!d) {
		if (!(d = static_cast<content *>(buffer::create(len)))) {
			return 0;
		}
		/* reserve uninitialized data */
		if (!d->append(len)) {
			d->unref();
			return 0;
		}
		_buf.set_instance(d);
	}
	void *ptr = d->data();
	if (base) {
		memcpy(ptr, base, len);
	} else {
		memset(ptr, 0, len);
	}
	return ptr;
}